

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O3

UINT8 device_start_c6280_mame(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  UINT8 UVar3;
  c6280_t *info;
  DEV_DATA DVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar21;
  int iVar22;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar10;
  
  uVar5 = cfg->clock;
  uVar7 = uVar5 >> 4;
  if (cfg->srMode == '\x02') {
    if (uVar7 <= cfg->smplRate) {
      uVar7 = cfg->smplRate;
    }
  }
  else if (cfg->srMode == '\x01') {
    uVar7 = cfg->smplRate;
  }
  DVar4.chipInf = calloc(1,0x4290);
  if (DVar4.chipInf == (void *)0x0) {
    UVar3 = 0xff;
  }
  else {
    dVar8 = (double)uVar5 / (double)uVar7;
    uVar5 = 1;
    do {
      *(int *)((long)DVar4.chipInf + (ulong)(uVar5 & 0xfff) * 4 + 0x28c) =
           (int)(long)((dVar8 * 4096.0) / (double)(int)uVar5);
      auVar2 = _DAT_00173c20;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x1001);
    dVar8 = dVar8 * 32.0;
    iVar11 = 2;
    iVar12 = 3;
    iVar13 = 0;
    iVar14 = 1;
    lVar6 = 0x83;
    do {
      auVar16._0_4_ = iVar13 + 1;
      auVar19._4_4_ = 0;
      auVar19._0_4_ = iVar11 + 1;
      auVar19._8_4_ = iVar12 + 1;
      auVar19._12_4_ = 0;
      auVar20._0_8_ = SUB168(auVar19 | auVar2,0) - auVar2._0_8_;
      auVar20._8_8_ = SUB168(auVar19 | auVar2,8) - auVar2._8_8_;
      auVar16._4_4_ = 0;
      auVar16._8_4_ = iVar14 + 1;
      auVar16._12_4_ = 0;
      auVar24._0_8_ = SUB168(auVar16 | auVar2,0) - auVar2._0_8_;
      auVar24._8_8_ = SUB168(auVar16 | auVar2,8) - auVar2._8_8_;
      auVar23._8_8_ = dVar8;
      auVar23._0_8_ = dVar8;
      auVar24 = divpd(auVar23,auVar24);
      auVar15._8_8_ = dVar8;
      auVar15._0_8_ = dVar8;
      auVar16 = divpd(auVar15,auVar20);
      iVar17 = (int)auVar16._0_8_;
      iVar21 = (int)auVar16._8_8_;
      iVar18 = (int)auVar24._0_8_;
      iVar22 = (int)auVar24._8_8_;
      puVar1 = (ulong *)((long)DVar4.chipInf + lVar6 * 4);
      *puVar1 = CONCAT44((int)(auVar24._8_8_ - 2147483648.0),(int)(auVar24._0_8_ - 2147483648.0)) &
                CONCAT44(iVar22 >> 0x1f,iVar18 >> 0x1f) | CONCAT44(iVar22,iVar18);
      puVar1[1] = CONCAT44((int)(auVar16._8_8_ - 2147483648.0),(int)(auVar16._0_8_ - 2147483648.0))
                  & CONCAT44(iVar21 >> 0x1f,iVar17 >> 0x1f) | CONCAT44(iVar21,iVar17);
      iVar13 = iVar13 + 4;
      iVar14 = iVar14 + 4;
      iVar11 = iVar11 + 4;
      iVar12 = iVar12 + 4;
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0xa3);
    dVar8 = 341.3333333333333;
    lVar6 = 0xe6;
    do {
      *(short *)((long)DVar4.chipInf + lVar6 * 2) = (short)(int)dVar8;
      dVar8 = dVar8 / 1.1885022274370185;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x105);
    *(undefined2 *)((long)DVar4.chipInf + 0x20a) = 0;
    auVar2 = _DAT_001733d0;
    lVar6 = 0x78;
    auVar9 = _DAT_001733c0;
    do {
      if (SUB164(auVar9 ^ auVar2,4) == -0x80000000 && SUB164(auVar9 ^ auVar2,0) < -0x7ffffffa) {
        *(undefined1 *)((long)DVar4.chipInf + lVar6 + -0x38) = 0;
        *(undefined1 *)((long)DVar4.chipInf + lVar6) = 0;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar6 = lVar6 + 0x70;
    } while (lVar6 != 0x1c8);
    *(void **)DVar4.chipInf = DVar4.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar4.chipInf;
    retDevInf->sampleRate = uVar7;
    retDevInf->devDef = &devDef_C6280_MAME;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_c6280_mame(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	void* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->clock / 16;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	chip = device_start_c6280mame(cfg->clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	devData = (DEV_DATA*)chip;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_C6280_MAME);
	return 0x00;
}